

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void cleanup_player_prop(void)

{
  player_ability *ppVar1;
  player_ability *totrash;
  player_ability *ability;
  
  totrash = player_abilities;
  while (totrash != (player_ability *)0x0) {
    ppVar1 = totrash->next;
    string_free(totrash->type);
    string_free(totrash->desc);
    string_free(totrash->name);
    mem_free(totrash);
    totrash = ppVar1;
  }
  return;
}

Assistant:

static void cleanup_player_prop(void)
{
	struct player_ability *ability = player_abilities;
	while (ability) {
		struct player_ability *totrash = ability;
		ability = ability->next;
		string_free(totrash->type);
		string_free(totrash->desc);
		string_free(totrash->name);
		mem_free(totrash);
	}
}